

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O3

int arkRelax(ARKodeMem ark_mem,int *relax_fails,sunrealtype *dsm_inout)

{
  long *plVar1;
  ARKodeRelaxMem pAVar2;
  ARKodeRelaxMem pAVar3;
  ARKodeRelaxMem pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  sunrealtype relax_param;
  N_Vector p_Var9;
  double dVar10;
  double dVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  sunrealtype *psVar23;
  sunrealtype *psVar24;
  undefined8 uVar25;
  N_Vector p_Var26;
  N_Vector p_Var27;
  ulong uVar28;
  sunrealtype fa;
  sunrealtype *local_a0;
  N_Vector local_98;
  ulong uStack_90;
  N_Vector local_88;
  sunrealtype *local_80;
  double local_78;
  int *local_70;
  sunrealtype local_68;
  ulong uStack_60;
  N_Vector local_58;
  ulong uStack_50;
  sunrealtype *local_48;
  undefined8 uStack_40;
  
  pAVar2 = ark_mem->relax_mem;
  if (pAVar2 == (ARKodeRelaxMem)0x0) {
    arkProcessError(ark_mem,-0x2c,0x364,"arkRelax",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"Relaxation memory is NULL.");
    return -0x2c;
  }
  iVar5 = (*pAVar2->delta_e_fn)
                    (ark_mem,pAVar2->relax_jac_fn,&pAVar2->num_relax_jac_evals,&pAVar2->delta_e);
  if (iVar5 == 0) {
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->ycur,ark_mem->yn,ark_mem->tempv2);
    iVar5 = (*pAVar2->relax_fn)(ark_mem->yn,&pAVar2->e_old,ark_mem->user_data);
    pAVar2->num_relax_fn_evals = pAVar2->num_relax_fn_evals + 1;
    if (iVar5 < 0) {
      return -0x2d;
    }
    if (iVar5 != 0) goto LAB_0015a6ea;
    pAVar2->relax_param = pAVar2->relax_param_prev;
    local_70 = relax_fails;
    if (pAVar2->solver != ARK_RELAX_NEWTON) {
      if (pAVar2->solver != ARK_RELAX_BRENT) {
        return -0x16;
      }
      pAVar3 = ark_mem->relax_mem;
      uStack_90 = 0;
      local_98 = (N_Vector)(pAVar3->relax_param * 1.1);
      p_Var26 = (N_Vector)(pAVar3->relax_param * 0.9);
      iVar5 = 10;
      iVar7 = -0x2d;
      do {
        local_58 = local_98;
        local_98 = p_Var26;
        uStack_50 = uStack_90;
        iVar6 = arkRelaxResidual((sunrealtype)p_Var26,(sunrealtype *)&local_a0,ark_mem);
        plVar1 = &ark_mem->relax_mem->num_relax_fn_evals;
        *plVar1 = *plVar1 + 1;
        if (iVar6 < 0) goto LAB_0015ae7d;
        if (iVar6 != 0) goto LAB_0015ae74;
        psVar23 = local_a0;
        if (ABS((double)local_a0) < pAVar3->res_tol) goto LAB_0015aa9c;
        p_Var9 = local_58;
        uVar28 = uStack_50;
        p_Var26 = local_98;
        if ((double)local_a0 < 0.0) break;
        local_80 = local_a0;
        p_Var26 = (N_Vector)((double)local_98 * 0.9);
        iVar5 = iVar5 + -1;
        p_Var9 = local_98;
        uVar28 = uStack_90;
      } while (iVar5 != 0);
      local_98 = p_Var26;
      if ((double)local_a0 <= 0.0) {
        iVar5 = 10;
        uStack_90 = uVar28;
        do {
          local_88 = local_98;
          local_98 = p_Var9;
          iVar6 = arkRelaxResidual((sunrealtype)p_Var9,(sunrealtype *)&local_80,ark_mem);
          pAVar4 = ark_mem->relax_mem;
          plVar1 = &pAVar4->num_relax_fn_evals;
          *plVar1 = *plVar1 + 1;
          if (iVar6 < 0) goto LAB_0015ae7d;
          if (iVar6 != 0) goto LAB_0015ae74;
          psVar23 = local_80;
          if (ABS((double)local_80) < pAVar3->res_tol) goto LAB_0015aa9c;
          if (0.0 < (double)local_80) {
            p_Var9 = local_98;
            local_98 = local_88;
            uVar28 = 0;
            break;
          }
          local_a0 = local_80;
          p_Var9 = (N_Vector)((double)local_98 * 1.1);
          iVar5 = iVar5 + -1;
          uVar28 = uStack_90;
        } while (iVar5 != 0);
        if (((double)local_80 < 0.0) || (pAVar4->max_iters < 1)) {
          iVar7 = 3;
          goto LAB_0015ae7d;
        }
        iVar5 = 0;
        local_78 = 0.0;
        uVar12 = uStack_90;
        dVar11 = 0.0;
        psVar23 = local_a0;
        uVar25 = 0;
        p_Var27 = local_98;
        p_Var26 = local_98;
        uVar13 = uVar28;
        do {
          if (((double)psVar23 <= 0.0) || ((double)local_80 <= 0.0)) {
            dVar8 = local_78;
            if (0.0 <= (double)psVar23) {
              uVar14 = 0;
            }
            else {
              uVar14 = 0;
              if ((double)local_80 < 0.0) goto LAB_0015ab4f;
            }
          }
          else {
LAB_0015ab4f:
            uVar25 = 0;
            dVar11 = (double)p_Var9 - (double)p_Var26;
            dVar8 = dVar11;
            uVar14 = uVar12;
            psVar23 = local_a0;
            p_Var27 = p_Var26;
            uVar28 = uVar13;
          }
          local_98 = p_Var9;
          uVar13 = uVar12;
          psVar24 = psVar23;
          if (ABS((double)psVar23) < ABS((double)local_80)) {
            local_a0 = local_80;
            uVar25 = 0;
            local_98 = p_Var27;
            uVar13 = uVar28;
            p_Var26 = p_Var9;
            psVar24 = local_80;
            p_Var27 = p_Var9;
            uVar28 = uVar12;
            local_80 = psVar23;
          }
          dVar10 = ABS((double)local_98) * pAVar3->rel_tol + pAVar3->abs_tol * 0.5;
          dVar15 = ((double)p_Var27 - (double)local_98) * 0.5;
          dVar16 = ABS(dVar15);
          psVar23 = local_80;
          if ((dVar16 < dVar10) || (ABS((double)local_80) < pAVar3->res_tol)) goto LAB_0015aa9c;
          local_78 = dVar15;
          local_68 = dVar15;
          if ((dVar10 <= ABS(dVar11)) && (ABS((double)local_80) < ABS((double)local_a0))) {
            dVar17 = (double)local_80 / (double)local_a0;
            dVar22 = dVar15 + dVar15;
            if (((double)p_Var26 != (double)p_Var27) ||
               (NAN((double)p_Var26) || NAN((double)p_Var27))) {
              auVar20._8_8_ = local_80;
              auVar20._0_8_ = local_a0;
              auVar21._8_8_ = psVar24;
              auVar21._0_8_ = psVar24;
              auVar21 = divpd(auVar20,auVar21);
              dVar19 = auVar21._0_8_;
              dVar18 = auVar21._8_8_ + -1.0;
              dVar22 = (dVar19 - auVar21._8_8_) * dVar22 * dVar19 -
                       ((double)local_98 - (double)p_Var26) * dVar18;
              dVar19 = (dVar17 + -1.0) * dVar18 * (dVar19 + -1.0);
            }
            else {
              dVar19 = 1.0 - dVar17;
            }
            dVar22 = dVar22 * dVar17;
            dVar18 = -dVar22;
            dVar17 = dVar22;
            if (dVar22 <= dVar18) {
              dVar17 = dVar18;
            }
            dVar19 = (double)(~-(ulong)(dVar18 < dVar22) & (ulong)dVar19 |
                             (ulong)-dVar19 & -(ulong)(dVar18 < dVar22));
            dVar22 = dVar15 * 3.0 * dVar19 - ABS(dVar10 * dVar19);
            if (ABS(dVar11 * dVar19) <= dVar22) {
              dVar22 = ABS(dVar11 * dVar19);
            }
            if (dVar17 + dVar17 < dVar22) {
              dVar16 = ABS(dVar17 / dVar19);
              local_78 = dVar17 / dVar19;
              local_68 = dVar8;
              uVar28 = uVar14;
            }
          }
          uStack_50 = uVar13;
          if (dVar16 <= dVar10) {
            if (dVar15 <= 0.0) {
              local_58 = (N_Vector)((double)local_98 - dVar10);
            }
            else {
              local_58 = (N_Vector)(dVar10 + (double)local_98);
              uStack_50 = uVar13 & 0x7fffffffffffffff;
            }
          }
          else {
            local_58 = (N_Vector)((double)local_98 + local_78);
          }
          local_a0 = local_80;
          uStack_90 = uVar13;
          local_88 = p_Var27;
          uStack_60 = uVar28;
          local_48 = psVar24;
          uStack_40 = uVar25;
          iVar6 = arkRelaxResidual((sunrealtype)local_58,(sunrealtype *)&local_80,ark_mem);
          pAVar4 = ark_mem->relax_mem;
          plVar1 = &pAVar4->num_relax_fn_evals;
          *plVar1 = *plVar1 + 1;
          if (iVar6 < 0) goto LAB_0015ae7d;
          uVar28 = 0;
          if (iVar6 != 0) goto LAB_0015ae74;
          iVar5 = iVar5 + 1;
          p_Var9 = local_58;
          uVar12 = uStack_50;
          dVar11 = local_68;
          psVar23 = local_48;
          uVar25 = uStack_40;
          p_Var27 = local_88;
          p_Var26 = local_98;
          uVar13 = uStack_90;
        } while (iVar5 < pAVar4->max_iters);
      }
      iVar7 = 3;
      goto LAB_0015ae7d;
    }
    pAVar3 = ark_mem->relax_mem;
    iVar5 = 3;
    if (0 < pAVar3->max_iters) {
      local_48 = &pAVar3->res;
      relax_param = pAVar3->relax_param;
      iVar6 = 0;
      do {
        iVar7 = arkRelaxResidual(relax_param,local_48,ark_mem);
        if (iVar7 != 0) goto LAB_0015ae7d;
        if (ABS(pAVar3->res) < pAVar3->res_tol) goto LAB_0015ae92;
        local_88 = (N_Vector)CONCAT44(local_88._4_4_,iVar6);
        p_Var26 = ark_mem->tempv2;
        local_58 = ark_mem->tempv3;
        p_Var9 = ark_mem->tempv4;
        local_68 = ark_mem->relax_mem->delta_e;
        local_98 = (N_Vector)ark_mem->user_data;
        N_VLinearSum(0x3ff0000000000000,pAVar3->relax_param,ark_mem->yn,p_Var26);
        iVar7 = (*ark_mem->relax_mem->relax_jac_fn)(local_58,p_Var9,local_98);
        plVar1 = &ark_mem->relax_mem->num_relax_jac_evals;
        *plVar1 = *plVar1 + 1;
        if (iVar7 < 0) {
          iVar5 = -0x2e;
          break;
        }
        if (iVar7 != 0) {
          iVar5 = 2;
          break;
        }
        dVar8 = (double)N_VDotProd(p_Var26,p_Var9);
        pAVar3->jac = dVar8 - local_68;
        dVar11 = pAVar3->relax_param;
        dVar8 = pAVar3->res / (dVar8 - local_68);
        relax_param = dVar11 - dVar8;
        pAVar3->relax_param = relax_param;
        pAVar3->nls_iters = pAVar3->nls_iters + 1;
        if (ABS(dVar8) < ABS(dVar11) * pAVar3->rel_tol + pAVar3->abs_tol) goto LAB_0015ae92;
        iVar6 = (int)local_88 + 1;
      } while (iVar6 < ark_mem->relax_mem->max_iters);
    }
    goto LAB_0015ae81;
  }
  goto LAB_0015a668;
LAB_0015aa9c:
  pAVar3->res = (sunrealtype)psVar23;
  pAVar3->relax_param = (sunrealtype)local_98;
  iVar7 = 0;
  goto LAB_0015ae7d;
LAB_0015ae74:
  iVar7 = 1;
LAB_0015ae7d:
  iVar5 = iVar7;
  if (iVar7 == 0) {
LAB_0015ae92:
    local_98 = (N_Vector)ark_mem->relax_mem->relax_param;
    if ((pAVar2->lower_bound <= (double)local_98) &&
       ((double)local_98 < pAVar2->upper_bound || (double)local_98 == pAVar2->upper_bound)) {
      pAVar2->relax_param_prev = pAVar2->relax_param;
      ark_mem->h = ark_mem->h * (double)local_98;
      iVar5 = (*pAVar2->get_order_fn)(ark_mem);
      dVar11 = (double)SUNRpowerI(local_98,iVar5);
      *dsm_inout = dVar11 * *dsm_inout;
      N_VLinearSum(local_98,1.0 - (double)local_98,ark_mem->ycur,ark_mem->yn,ark_mem->ycur);
      return 0;
    }
    pAVar2->bound_fails = pAVar2->bound_fails + 1;
    relax_fails = local_70;
  }
  else {
LAB_0015ae81:
    pAVar2->nls_fails = pAVar2->nls_fails + 1;
    relax_fails = local_70;
LAB_0015a668:
    if (iVar5 < 0) {
      return iVar5;
    }
  }
LAB_0015a6ea:
  pAVar2->num_fails = pAVar2->num_fails + 1;
  iVar5 = *relax_fails;
  *relax_fails = iVar5 + 1;
  iVar7 = -0x2b;
  if (((iVar5 + 1 != pAVar2->max_fails) && (ark_mem->hmin * 1.000001 < ABS(ark_mem->h))) &&
     (ark_mem->fixedstep == 0)) {
    ark_mem->eta = pAVar2->eta_fail;
    iVar7 = 5;
  }
  return iVar7;
}

Assistant:

int arkRelax(ARKodeMem ark_mem, int* relax_fails, sunrealtype* dsm_inout)
{
  int retval;
  sunrealtype relax_val;
  ARKodeRelaxMem relax_mem = ark_mem->relax_mem;

  /* Get the relaxation memory structure */
  if (!relax_mem)
  {
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_RELAX_MEM_NULL);
    return ARK_RELAX_MEM_NULL;
  }

  /* Compute the relaxation parameter */
  retval = arkRelaxSolve(ark_mem, relax_mem, &relax_val);
  if (retval < 0) { return retval; }
  if (retval > 0)
  {
    /* Update failure counts */
    relax_mem->num_fails++;
    (*relax_fails)++;

    /* Check for max fails in a step */
    if (*relax_fails == relax_mem->max_fails) { return ARK_RELAX_FAIL; }

    /* Return with an error if |h| == hmin */
    if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
    {
      return ARK_RELAX_FAIL;
    }

    /* Return with error if using fixed step sizes */
    if (ark_mem->fixedstep) { return (ARK_RELAX_FAIL); }

    /* Cut step size and try again */
    ark_mem->eta = relax_mem->eta_fail;

    return TRY_AGAIN;
  }

  /* Update step size and error estimate */
  ark_mem->h *= relax_val;
  *dsm_inout *= SUNRpowerI(relax_val, relax_mem->get_order_fn(ark_mem));

  /* Relax solution */
  N_VLinearSum(relax_val, ark_mem->ycur, (ONE - relax_val), ark_mem->yn,
               ark_mem->ycur);

  SUNLogDebug(ARK_LOGGER, "relaxation",
              "relaxation parameter = " SUN_FORMAT_G
              ", relaxed h = " SUN_FORMAT_G ", relaxed error = " SUN_FORMAT_G,
              relax_val, ark_mem->h, *dsm_inout);

  return ARK_SUCCESS;
}